

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamFtp::ConnectDataSocket(BamFtp *this)

{
  bool bVar1;
  long lVar2;
  string restartCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string passiveCommand;
  string retrieveCommand;
  
  bVar1 = TcpSocket::IsConnected(this->m_commandSocket);
  if ((!bVar1) && (bVar1 = ConnectCommandSocket(this), !bVar1)) {
    return false;
  }
  bVar1 = TcpSocket::IsConnected(this->m_dataSocket);
  if (bVar1) {
    TcpSocket::DisconnectFromHost(this->m_dataSocket);
  }
  std::operator+(&passiveCommand,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 PASV_CMD_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FTP_NEWLINE_abi_cxx11_);
  bVar1 = SendCommand(this,&passiveCommand,true);
  if ((!bVar1) || (bVar1 = ParsePassiveResponse(this), !bVar1)) {
LAB_0014e30a:
    bVar1 = false;
    goto LAB_0014e30c;
  }
  if (-1 < this->m_filePosition) {
    std::__cxx11::string::string((string *)&restartCommand,"",(allocator *)&local_228);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&retrieveCommand,(string *)&restartCommand,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&restartCommand);
    std::ostream::_M_insert<long>((long)&retrieveCommand.field_2);
    std::operator+(&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   REST_CMD_abi_cxx11_,' ');
    std::__cxx11::stringbuf::str();
    std::operator+(&local_228,&local_1e8,&local_208);
    std::operator+(&restartCommand,&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   FTP_NEWLINE_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    bVar1 = SendCommand(this,&restartCommand,true);
    std::__cxx11::string::~string((string *)&restartCommand);
    std::__cxx11::stringstream::~stringstream((stringstream *)&retrieveCommand);
    if (!bVar1) goto LAB_0014e30a;
  }
  std::operator+(&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 RETR_CMD_abi_cxx11_,' ');
  std::operator+(&restartCommand,&local_228,&this->m_filename);
  std::operator+(&retrieveCommand,&restartCommand,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FTP_NEWLINE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&restartCommand);
  std::__cxx11::string::~string((string *)&local_228);
  bVar1 = SendCommand(this,&retrieveCommand,false);
  if ((bVar1) &&
     (bVar1 = TcpSocket::ConnectToHost
                        (this->m_dataSocket,&this->m_dataHostname,this->m_dataPort,ReadOnly), bVar1)
     ) {
    bVar1 = ReceiveReply(this);
    if (!bVar1) {
LAB_0014e2f0:
      TcpSocket::DisconnectFromHost(this->m_dataSocket);
      goto LAB_0014e2f9;
    }
    std::__cxx11::string::string((string *)&restartCommand,"150",(allocator *)&local_228);
    lVar2 = std::__cxx11::string::find((string *)&this->m_response,(ulong)&restartCommand);
    std::__cxx11::string::~string((string *)&restartCommand);
    if (lVar2 != 0) goto LAB_0014e2f0;
    bVar1 = true;
  }
  else {
LAB_0014e2f9:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&retrieveCommand);
LAB_0014e30c:
  std::__cxx11::string::~string((string *)&passiveCommand);
  return bVar1;
}

Assistant:

bool BamFtp::ConnectDataSocket(void) {

    // failure if can't connect to command socket first
    if ( !m_commandSocket->IsConnected() ) {
        if ( !ConnectCommandSocket() )
            return false;
    }

    // make sure we're starting with a fresh data channel
    if ( m_dataSocket->IsConnected() )
        m_dataSocket->DisconnectFromHost();

    // send passive connection command
    const string passiveCommand = PASV_CMD + FTP_NEWLINE;
    if ( !SendCommand(passiveCommand, true) ) {
        // TODO: set error string
        return false;
    }

    // retrieve passive connection port
    if ( !ParsePassiveResponse() ) {
        // TODO: set error string
        return false;
    }

    // set up restart command (tell server where to start fetching bytes from)
    if ( m_filePosition >= 0 ) {

        stringstream fpStream("");
        fpStream << m_filePosition;
        string restartCommand = REST_CMD + CMD_SEPARATOR + fpStream.str() + FTP_NEWLINE;
        if ( !SendCommand(restartCommand, true) ) {
            // TODO: set error string
            return false;
        }
    }

    // main file retrieval request
    string retrieveCommand = RETR_CMD + CMD_SEPARATOR + m_filename + FTP_NEWLINE;
    if ( !SendCommand(retrieveCommand, false) ) {
        // TODO: set error string
        return false;
    }

    // make data channel connection
    if ( !m_dataSocket->ConnectToHost(m_dataHostname, m_dataPort) ) {
        // TODO: set error string
        return false;
    }

    // fetch intial reply from server
    if ( !ReceiveReply() ) {
        // TODO: set error string
        m_dataSocket->DisconnectFromHost();
        return false;
    }

    // make sure we have reply code 150 (all good)
    if ( !startsWith(m_response, "150") ) {
        // TODO: set error string
        m_dataSocket->DisconnectFromHost();
        return false;
    }

    // return success
    return true;
}